

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlDOMWrapStoreNs(xmlDocPtr doc,xmlChar *nsName,xmlChar *prefix)

{
  int iVar1;
  xmlNsPtr pxVar2;
  xmlNsPtr local_30;
  xmlNsPtr ns;
  xmlChar *prefix_local;
  xmlChar *nsName_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    local_30 = xmlTreeEnsureXMLDecl(doc);
    if (local_30 == (xmlNsPtr)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      if (local_30->next != (_xmlNs *)0x0) {
        for (local_30 = local_30->next; local_30 != (xmlNsPtr)0x0; local_30 = local_30->next) {
          if (((local_30->prefix == prefix) ||
              (iVar1 = xmlStrEqual(local_30->prefix,prefix), iVar1 != 0)) &&
             (iVar1 = xmlStrEqual(local_30->href,nsName), iVar1 != 0)) {
            return local_30;
          }
          if (local_30->next == (_xmlNs *)0x0) break;
        }
      }
      if (local_30 == (xmlNsPtr)0x0) {
        doc_local = (xmlDocPtr)0x0;
      }
      else {
        pxVar2 = xmlNewNs((xmlNodePtr)0x0,nsName,prefix);
        local_30->next = pxVar2;
        doc_local = (xmlDocPtr)local_30->next;
      }
    }
  }
  return (xmlNsPtr)doc_local;
}

Assistant:

static xmlNsPtr
xmlDOMWrapStoreNs(xmlDocPtr doc,
		   const xmlChar *nsName,
		   const xmlChar *prefix)
{
    xmlNsPtr ns;

    if (doc == NULL)
	return (NULL);
    ns = xmlTreeEnsureXMLDecl(doc);
    if (ns == NULL)
	return (NULL);
    if (ns->next != NULL) {
	/* Reuse. */
	ns = ns->next;
	while (ns != NULL) {
	    if (((ns->prefix == prefix) ||
		xmlStrEqual(ns->prefix, prefix)) &&
		xmlStrEqual(ns->href, nsName)) {
		return (ns);
	    }
	    if (ns->next == NULL)
		break;
	    ns = ns->next;
	}
    }
    /* Create. */
    if (ns != NULL) {
        ns->next = xmlNewNs(NULL, nsName, prefix);
        return (ns->next);
    }
    return(NULL);
}